

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

Status __thiscall
flatbuffers::anon_unknown_7::TextCodeGenerator::GenerateMakeRule
          (TextCodeGenerator *this,Parser *parser,string *path,string *filename,string *output)

{
  pointer pcVar1;
  long *plVar2;
  _Rb_tree_node_base *p_Var3;
  size_type *psVar4;
  ulong *puVar5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  included_files;
  string filebase;
  string local_c8;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  undefined1 local_88 [48];
  string *local_58;
  string local_50;
  
  if (((parser->builder_).buf_.size_ == 0) || (parser->root_struct_def_ == (StructDef *)0x0)) {
    local_a8 = &local_98;
    local_a0 = 0;
    local_98 = local_98 & 0xffffffffffffff00;
  }
  else {
    StripExtension((string *)local_88,filename);
    StripPath(&local_50,(string *)local_88);
    pcVar1 = local_88 + 0x10;
    if ((pointer)local_88._0_8_ != pcVar1) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    TextFileName(&local_c8,path,&local_50);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar4) {
      local_88._16_8_ = *psVar4;
      local_88._24_8_ = plVar2[3];
      local_88._0_8_ = pcVar1;
    }
    else {
      local_88._16_8_ = *psVar4;
      local_88._0_8_ = (size_type *)*plVar2;
    }
    local_88._8_8_ = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append(local_88,(ulong)(filename->_M_dataplus)._M_p);
    local_a8 = &local_98;
    puVar5 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar5) {
      local_98 = *puVar5;
      lStack_90 = plVar2[3];
    }
    else {
      local_98 = *puVar5;
      local_a8 = (ulong *)*plVar2;
    }
    local_a0 = plVar2[1];
    *plVar2 = (long)puVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((pointer)local_88._0_8_ != pcVar1) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_58 = output;
    Parser::GetIncludedFilesRecursive
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_88,parser,&(parser->root_struct_def_->super_Definition).file);
    if ((_Rb_tree_node_base *)local_88._24_8_ != (_Rb_tree_node_base *)(local_88 + 8)) {
      p_Var3 = (_Rb_tree_node_base *)local_88._24_8_;
      do {
        std::operator+(&local_c8," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var3 + 1));
        std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_c8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      } while (p_Var3 != (_Rb_tree_node_base *)(local_88 + 8));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
    output = local_58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      output = local_58;
    }
  }
  std::__cxx11::string::operator=((string *)output,(string *)&local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  return OK;
}

Assistant:

Status GenerateMakeRule(const Parser &parser, const std::string &path,
                          const std::string &filename,
                          std::string &output) override {
    output = TextMakeRule(parser, path, filename);
    return Status::OK;
  }